

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SSC32.h
# Opt level: O0

int SetThrustersSSC32(SSC32 *pSSC32,double urt,double ult)

{
  int iVar1;
  int local_140;
  int local_13c;
  int local_138;
  int local_134;
  int local_130;
  int local_12c;
  int local_128 [2];
  int pws [32];
  int selectedchannels [32];
  double ult_local;
  double urt_local;
  SSC32 *pSSC32_local;
  
  memset(pws + 0x1e,0,0x80);
  memset(local_128,0,0x80);
  pws[(long)pSSC32->rightthrusterchan + -2] = (int)((urt * 1000.0) / 2.0) + 0x5dc;
  pws[(long)pSSC32->leftthrusterchan + -2] = (int)((ult * 1000.0) / 2.0) + 0x5dc;
  if (pws[(long)pSSC32->rightthrusterchan + -2] < 2000) {
    local_12c = pws[(long)pSSC32->rightthrusterchan + -2];
  }
  else {
    local_12c = 2000;
  }
  if (local_12c < 0x3e9) {
    local_134 = 1000;
  }
  else {
    if (pws[(long)pSSC32->rightthrusterchan + -2] < 2000) {
      local_130 = pws[(long)pSSC32->rightthrusterchan + -2];
    }
    else {
      local_130 = 2000;
    }
    local_134 = local_130;
  }
  pws[(long)pSSC32->rightthrusterchan + -2] = local_134;
  if (pws[(long)pSSC32->leftthrusterchan + -2] < 2000) {
    local_138 = pws[(long)pSSC32->leftthrusterchan + -2];
  }
  else {
    local_138 = 2000;
  }
  if (local_138 < 0x3e9) {
    local_140 = 1000;
  }
  else {
    if (pws[(long)pSSC32->leftthrusterchan + -2] < 2000) {
      local_13c = pws[(long)pSSC32->leftthrusterchan + -2];
    }
    else {
      local_13c = 2000;
    }
    local_140 = local_13c;
  }
  pws[(long)pSSC32->leftthrusterchan + -2] = local_140;
  pws[(long)pSSC32->rightthrusterchan + 0x1e] = 1;
  pws[(long)pSSC32->leftthrusterchan + 0x1e] = 1;
  iVar1 = SetAllPWMsSSC32(pSSC32,pws + 0x1e,local_128);
  return iVar1;
}

Assistant:

inline int SetThrustersSSC32(SSC32* pSSC32, double urt, double ult)
{
	int selectedchannels[NB_CHANNELS_PWM_SSC32];
	int pws[NB_CHANNELS_PWM_SSC32];

	memset(selectedchannels, 0, sizeof(selectedchannels));
	memset(pws, 0, sizeof(pws));

	// Convert u (in [-1;1]) into SSC32 pulse width (in us).
	pws[pSSC32->rightthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(urt*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);
	pws[pSSC32->leftthrusterchan] = DEFAULT_MID_PW_SSC32+(int)(ult*(DEFAULT_MAX_PW_SSC32-DEFAULT_MIN_PW_SSC32)/2.0);

	pws[pSSC32->rightthrusterchan] = max(min(pws[pSSC32->rightthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);
	pws[pSSC32->leftthrusterchan] = max(min(pws[pSSC32->leftthrusterchan], DEFAULT_MAX_PW_SSC32), DEFAULT_MIN_PW_SSC32);

	selectedchannels[pSSC32->rightthrusterchan] = 1;
	selectedchannels[pSSC32->leftthrusterchan] = 1;

	return SetAllPWMsSSC32(pSSC32, selectedchannels, pws);
}